

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinition.cpp
# Opt level: O0

Def * Shell::FunctionDefinition::isFunctionDefinition(FormulaUnit *unit,bool inHigherOrder)

{
  Connective CVar1;
  FormulaUnit *in_RDI;
  Formula *f;
  undefined8 local_20;
  undefined1 inHigherOrder_00;
  Literal *in_stack_fffffffffffffff8;
  Def *pDVar2;
  
  local_20 = Kernel::FormulaUnit::formula(in_RDI);
  while( true ) {
    CVar1 = Kernel::Formula::connective(local_20);
    inHigherOrder_00 = (undefined1)((ulong)in_RDI >> 0x38);
    if (CVar1 != FORALL) break;
    local_20 = Kernel::Formula::qarg((Formula *)0xb9ca6a);
  }
  CVar1 = Kernel::Formula::connective(local_20);
  if (CVar1 == LITERAL) {
    Kernel::Formula::literal((Formula *)0xb9ca95);
    pDVar2 = isFunctionDefinition(in_stack_fffffffffffffff8,(bool)inHigherOrder_00);
  }
  else {
    pDVar2 = (Def *)0x0;
  }
  return pDVar2;
}

Assistant:

FunctionDefinition::Def*
FunctionDefinition::isFunctionDefinition (FormulaUnit& unit, bool inHigherOrder)
{
  Formula* f = unit.formula();
  // skip all universal quantifiers in front of the formula
  while (f->connective() == FORALL) {
    f = f->qarg();
  }

  if (f->connective() != LITERAL) {
    return 0;
  }
  return isFunctionDefinition(f->literal(), inHigherOrder);
}